

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O0

bool __thiscall TripleBuffer<stStateCore>::update(TripleBuffer<stStateCore> *this,bool force)

{
  byte bVar1;
  int32_t iVar2;
  mapped_type *this_00;
  mapped_type *pmVar3;
  byte in_SIL;
  stParameters *in_RDI;
  int i;
  lock_guard<std::mutex> lock;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_stack_00000050;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  int local_38;
  undefined7 in_stack_ffffffffffffffe8;
  stParameters *this_01;
  bool local_1;
  
  bVar1 = in_SIL & 1;
  this_01 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((((ulong)in_RDI[2].valuesPNonAlphabetic.super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) || ((bVar1 & 1) != 0)) {
    *(undefined1 *)
     &in_RDI[2].valuesPNonAlphabetic.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 1;
    memcpy(&in_RDI[2].valuesWEnglishFreq,in_RDI,0x82);
    if ((in_RDI->playbackId & 0x100) != 0) {
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::operator=(in_stack_00000050,
                  (vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                   *)this);
    }
    local_38 = 0;
    while( true ) {
      iVar2 = stParameters::nProcessors(in_RDI);
      if (iVar2 <= local_38) break;
      if ((*(byte *)((long)&in_RDI->playbackId + (long)local_38 + 2) & 1) != 0) {
        this_00 = std::
                  map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                  ::operator[]((map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                                *)this_01,
                               (key_type_conflict *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        pmVar3 = std::
                 map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                 ::operator[]((map<int,_Cipher::Processor,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
                               *)this_01,
                              (key_type_conflict *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        Cipher::Processor::operator=(this_00,pmVar3);
      }
      local_38 = local_38 + 1;
    }
    stStateCore::Flags::clear((Flags *)0x17bfbd);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x17bfd6);
  return local_1;
}

Assistant:

bool TripleBuffer<stStateCore>::update(bool force) {
    std::lock_guard<std::mutex> lock(mutex);
    if (hasChanged && force == false) return false;

    hasChanged = true;

    buffer.flags = this->flags;

    if (this->flags.updateSimilarityMap) {
        buffer.similarityMap = this->similarityMap;
    }

    for (int i = 0; i < this->params.nProcessors(); ++i) {
        if (this->flags.updateResult[i]) {
            buffer.processors[i] = this->processors[i];
        }
    }

    this->flags.clear();

    return true;
}